

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator fmt::v5::
         vformat_to<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>,char,fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>
                   (range out,basic_string_view<char> format_str,
                   basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                   args,locale_ref loc)

{
  size_t sVar1;
  undefined8 unaff_RBP;
  ulong uVar2;
  iterator iVar3;
  basic_string_view<char> format_str_00;
  undefined1 auStack_98 [8];
  internal *local_90;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  *local_88;
  undefined4 local_80;
  size_t local_78;
  char local_70;
  unsigned_long_long local_68;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>_2
  local_60;
  void *local_58;
  arg_map<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_> local_50
  ;
  undefined4 local_38;
  undefined4 local_28;
  
  local_60 = args.field_1;
  local_68 = args.types_;
  local_78 = out.it_.count_;
  local_88 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
              *)format_str.size_;
  local_90 = (internal *)format_str.data_;
  local_80 = 0;
  local_70 = out.it_.blackhole_;
  local_58 = loc.locale_;
  local_50.map_ = (entry *)0x0;
  local_50.size_ = 0;
  local_38 = 0;
  local_28 = 0;
  format_str_00.size_ = (size_t)auStack_98;
  format_str_00.data_ = (char *)local_88;
  internal::
  parse_format_string<false,char,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>,char,fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>&>
            (local_90,format_str_00,local_88);
  sVar1 = local_78;
  uVar2 = CONCAT71((int7)((ulong)unaff_RBP >> 8),local_70);
  internal::
  arg_map<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>::
  ~arg_map(&local_50);
  iVar3._8_8_ = uVar2 & 0xffffffff;
  iVar3.count_ = sVar1;
  return iVar3;
}

Assistant:

typename Context::iterator vformat_to(
    typename ArgFormatter::range out,
    basic_string_view<Char> format_str,
    basic_format_args<Context> args,
    internal::locale_ref loc = internal::locale_ref()) {
  format_handler<ArgFormatter, Char, Context> h(out, format_str, args, loc);
  internal::parse_format_string<false>(format_str, h);
  return h.context.out();
}